

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_> * __thiscall
pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
def_property_readonly<std::vector<anurbs::Ref<anurbs::BrepEdge>,std::allocator<anurbs::Ref<anurbs::BrepEdge>>>(anurbs::BrepLoop::*)()const>
          (class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *this,char *name,
          offset_in_Model_to_subr *fget)

{
  class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_> *pcVar1;
  return_value_policy local_49;
  offset_in_Model_to_subr local_48;
  void *local_38;
  offset_in_Model_to_subr local_30;
  cpp_function local_28;
  offset_in_Model_to_subr *local_20;
  offset_in_Model_to_subr *fget_local;
  char *name_local;
  class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_> *this_local;
  
  local_38 = (void *)*fget;
  local_30 = fget[1];
  local_20 = fget;
  fget_local = (offset_in_Model_to_subr *)name;
  name_local = (char *)this;
  local_48 = _anurbs__BrepLoop___pybind11__method_adaptor<anurbs::BrepLoop,std::vector<anurbs::Ref<anurbs::BrepEdge>,std::allocator<anurbs::Ref<anurbs::BrepEdge>>>,anurbs::BrepLoop>_std__vector<anurbs::Ref<anurbs::BrepEdge>,std::allocator<anurbs::Ref<anurbs::BrepEdge>>>_anurbs__BrepLoop______const__
                       (local_38,local_30);
  cpp_function::
  cpp_function<std::vector<anurbs::Ref<anurbs::BrepEdge>,std::allocator<anurbs::Ref<anurbs::BrepEdge>>>,anurbs::BrepLoop>
            (&local_28,local_48);
  local_49 = reference_internal;
  pcVar1 = class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_>::
           def_property_readonly<pybind11::return_value_policy>
                     ((class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_> *)this,name,
                      &local_28,&local_49);
  cpp_function::~cpp_function(&local_28);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }